

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitfield.cpp
# Opt level: O2

void __thiscall libtorrent::bitfield::resize(bitfield *this,int bits)

{
  _Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> _Var1;
  int iVar2;
  uint *in_RAX;
  pointer __p_00;
  int iVar3;
  ulong uVar4;
  pointer __p;
  int iVar5;
  _Head_base<0UL,_unsigned_int_*,_false> local_38;
  
  _Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
       (this->m_buf).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
       super__Head_base<0UL,_unsigned_int_*,_false>;
  if (_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = *(int *)_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
  }
  if (iVar5 != bits) {
    if (bits == 0) {
      std::__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>::reset
                ((__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> *)this,
                 (pointer)0x0);
      return;
    }
    iVar5 = (bits + 0x1f) / 0x20;
    if (_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = (*(int *)_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 0x1f) /
              0x20;
    }
    if (iVar5 == iVar3) {
      *(int *)_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = bits;
      local_38._M_head_impl = in_RAX;
    }
    else {
      uVar4 = 0xffffffffffffffff;
      if (-0x5f < bits) {
        uVar4 = (ulong)(iVar5 + 1) << 2;
      }
      __p_00 = (pointer)operator_new__(uVar4);
      *__p_00 = bits;
      if (_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != (uint *)0x0) {
        iVar2 = iVar5;
        if (iVar3 < iVar5) {
          iVar2 = iVar3;
        }
        memcpy(__p_00 + 1,
               (int *)((long)_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 4),
               (long)(iVar2 << 2));
      }
      if (iVar5 - iVar3 != 0 && iVar3 <= iVar5) {
        memset(__p_00 + (long)iVar3 + 1,0,(long)((iVar5 - iVar3) * 4));
      }
      local_38._M_head_impl = (uint *)0x0;
      std::__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>::reset
                ((__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> *)this,__p_00)
      ;
      std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
                ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)&local_38);
    }
    clear_trailing_bits(this);
  }
  return;
}

Assistant:

void bitfield::resize(int const bits)
	{
		if (bits == size()) return;

		TORRENT_ASSERT(bits >= 0);
		if (bits == 0)
		{
			m_buf.reset();
			return;
		}
		int const new_size_words = (bits + 31) / 32;
		int const cur_size_words = num_words();
		if (cur_size_words != new_size_words)
		{
			aux::unique_ptr<std::uint32_t[]> b(new std::uint32_t[std::size_t(new_size_words + 1)]);
#ifdef BOOST_NO_EXCEPTIONS
			if (b == nullptr) std::terminate();
#endif
			b[0] = aux::numeric_cast<std::uint32_t>(bits);
			if (m_buf) std::memcpy(&b[1], buf()
				, aux::numeric_cast<std::size_t>(std::min(new_size_words, cur_size_words) * 4));
			if (new_size_words > cur_size_words)
			{
				std::memset(&b[1 + cur_size_words], 0
					, aux::numeric_cast<std::size_t>((new_size_words - cur_size_words) * 4));
			}
			m_buf = std::move(b);
		}
		else
		{
			m_buf[0] = aux::numeric_cast<std::uint32_t>(bits);
		}

		clear_trailing_bits();
		TORRENT_ASSERT(size() == bits);
	}